

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_dec.cc
# Opt level: O3

uint64_t woff2::anon_unknown_0::ComputeOffsetToFirstTable(WOFF2Header *hdr)

{
  pointer pTVar1;
  long lVar2;
  uint64_t uVar3;
  const_iterator __begin3;
  pointer pTVar4;
  const_iterator __end3;
  
  if (hdr->header_version == 0) {
    uVar3 = (ulong)hdr->num_tables << 4 | 0xc;
  }
  else {
    lVar2 = woff2::CollectionHeaderSize
                      (hdr->header_version,
                       (int)((ulong)((long)(hdr->ttc_fonts).
                                           super__Vector_base<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(hdr->ttc_fonts).
                                          super__Vector_base<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x33333333);
    pTVar4 = (hdr->ttc_fonts).
             super__Vector_base<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (hdr->ttc_fonts).
             super__Vector_base<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = ((long)pTVar1 - (long)pTVar4 >> 3) * -0x6666666666666664 + lVar2;
    for (; pTVar1 != pTVar4; pTVar4 = pTVar4 + 1) {
      uVar3 = uVar3 + ((long)(pTVar4->table_indices).
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pTVar4->table_indices).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 8;
    }
  }
  return uVar3;
}

Assistant:

uint64_t ComputeOffsetToFirstTable(const WOFF2Header& hdr) {
  uint64_t offset = kSfntHeaderSize +
    kSfntEntrySize * static_cast<uint64_t>(hdr.num_tables);
  if (hdr.header_version) {
    offset = CollectionHeaderSize(hdr.header_version, hdr.ttc_fonts.size())
      + kSfntHeaderSize * hdr.ttc_fonts.size();
    for (const auto& ttc_font : hdr.ttc_fonts) {
      offset += kSfntEntrySize * ttc_font.table_indices.size();
    }
  }
  return offset;
}